

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void fs_read_file_eof(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __off64_t _Var6;
  void *pvVar7;
  void *pvVar8;
  char *pcVar9;
  long unaff_R12;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  void *pvVar13;
  uv_buf_t uVar14;
  undefined1 auVar15 [16];
  undefined1 auStack_f2 [2];
  code *pcStack_f0;
  undefined8 uStack_e8;
  long lStack_d8;
  void *pvStack_d0;
  long lStack_c8;
  undefined1 auStack_58 [16];
  undefined1 auStack_48 [16];
  undefined8 uStack_30;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    fs_read_file_eof_cold_1();
LAB_00158245:
    fs_read_file_eof_cold_2();
LAB_0015824a:
    fs_read_file_eof_cold_3();
LAB_0015824f:
    fs_read_file_eof_cold_4();
LAB_00158254:
    fs_read_file_eof_cold_5();
LAB_00158259:
    fs_read_file_eof_cold_6();
LAB_0015825e:
    fs_read_file_eof_cold_7();
LAB_00158263:
    fs_read_file_eof_cold_8();
LAB_00158268:
    fs_read_file_eof_cold_9();
LAB_0015826d:
    fs_read_file_eof_cold_10();
LAB_00158272:
    fs_read_file_eof_cold_11();
LAB_00158277:
    fs_read_file_eof_cold_12();
LAB_0015827c:
    fs_read_file_eof_cold_13();
LAB_00158281:
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158245;
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar3 = 0;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015824a;
    if (write_req.result < 0) goto LAB_0015824f;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158254;
    if (close_req.result != 0) goto LAB_00158259;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_0015825e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158263;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar14;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158268;
    if (read_req.result < 0) goto LAB_0015826d;
    iVar3 = 0x2e3070;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00158272;
    uv_fs_req_cleanup(&read_req);
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar3 = 0;
    iov = uVar14;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_00158277;
    if (read_req.result != 0) goto LAB_0015827c;
    uv_fs_req_cleanup();
    iVar3 = 0;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158281;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  fs_read_file_eof_cold_15();
  fs_write_multiple_bufs(iVar3);
  fs_write_multiple_bufs(iVar3);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar5 = uv_default_loop();
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_30 = uVar4;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar3 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar3 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00158766:
    fs_write_multiple_bufs_cold_2();
LAB_0015876b:
    fs_write_multiple_bufs_cold_3();
LAB_00158770:
    fs_write_multiple_bufs_cold_4();
LAB_00158775:
    fs_write_multiple_bufs_cold_5();
LAB_0015877a:
    fs_write_multiple_bufs_cold_6();
LAB_0015877f:
    fs_write_multiple_bufs_cold_7();
LAB_00158784:
    fs_write_multiple_bufs_cold_8();
LAB_00158789:
    fs_write_multiple_bufs_cold_9();
LAB_0015878e:
    fs_write_multiple_bufs_cold_10();
LAB_00158793:
    fs_write_multiple_bufs_cold_11();
LAB_00158798:
    fs_write_multiple_bufs_cold_12();
LAB_0015879d:
    fs_write_multiple_bufs_cold_13();
LAB_001587a2:
    fs_write_multiple_bufs_cold_14();
LAB_001587a7:
    fs_write_multiple_bufs_cold_15();
LAB_001587ac:
    fs_write_multiple_bufs_cold_16();
LAB_001587b1:
    fs_write_multiple_bufs_cold_19();
LAB_001587b6:
    fs_write_multiple_bufs_cold_20();
LAB_001587bb:
    fs_write_multiple_bufs_cold_21();
LAB_001587c0:
    fs_write_multiple_bufs_cold_22();
LAB_001587c5:
    fs_write_multiple_bufs_cold_23();
LAB_001587ca:
    fs_write_multiple_bufs_cold_24();
LAB_001587cf:
    fs_write_multiple_bufs_cold_25();
LAB_001587d4:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00158766;
    uv_fs_req_cleanup(&open_req1);
    auStack_58 = uv_buf_init(test_buf,0xd);
    auStack_48 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_58,2,0);
    if (iVar3 < 0) goto LAB_0015876b;
    if (write_req.result < 0) goto LAB_00158770;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158775;
    if (close_req.result != 0) goto LAB_0015877a;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_0015877f;
    if (open_req1.result._4_4_ < 0) goto LAB_00158784;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar15 = uv_buf_init(buf,0xd);
    auStack_58 = auVar15;
    auVar15 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_48 = auVar15;
    _Var6 = lseek64((int)open_req1.result,0,1);
    if (_Var6 != 0) goto LAB_00158789;
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_58,2,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_0015878e;
    if (read_req.result != 0x1c) goto LAB_00158793;
    iVar2 = 0x2e3070;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_00158798;
    iVar2 = 0x2e4460;
    iVar3 = strcmp(buf2,test_buf2);
    if (iVar3 != 0) goto LAB_0015879d;
    uv_fs_req_cleanup(&read_req);
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_001587a2;
    if (read_req.result != 0) goto LAB_001587a7;
    uv_fs_req_cleanup(&read_req);
    auVar15 = uv_buf_init(buf,0xd);
    auStack_58 = auVar15;
    auVar15 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_48 = auVar15;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_58,2,0);
    if (iVar3 < 0) goto LAB_001587ac;
    if (read_req.result == 0x1c) {
LAB_00158664:
      iVar2 = 0x2e3070;
      iVar3 = strcmp(buf,test_buf);
      if (iVar3 != 0) goto LAB_001587b1;
      iVar2 = 0x2e4460;
      iVar3 = strcmp(buf2,test_buf2);
      if (iVar3 != 0) goto LAB_001587b6;
      uv_fs_req_cleanup(&read_req);
      uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar14;
      iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar3 != 0) goto LAB_001587bb;
      if (read_req.result != 0) goto LAB_001587c0;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar3 != 0) goto LAB_001587c5;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_001587ca;
    }
    if (read_req.result != 0xd) goto LAB_001587cf;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_48,1,read_req.result);
    if (iVar3 < 0) goto LAB_001587d4;
    if (read_req.result == 0xf) goto LAB_00158664;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar7 = malloc(0xd4310);
  if (pvVar7 == (void *)0x0) {
LAB_00158b56:
    fs_write_alotof_bufs_cold_18();
LAB_00158b5b:
    fs_write_alotof_bufs_cold_1();
LAB_00158b60:
    fs_write_alotof_bufs_cold_2();
LAB_00158b65:
    fs_write_alotof_bufs_cold_3();
LAB_00158b6a:
    fs_write_alotof_bufs_cold_4();
LAB_00158b6f:
    fs_write_alotof_bufs_cold_17();
LAB_00158b74:
    fs_write_alotof_bufs_cold_5();
LAB_00158b79:
    fs_write_alotof_bufs_cold_6();
LAB_00158b7e:
    fs_write_alotof_bufs_cold_7();
LAB_00158b83:
    fs_write_alotof_bufs_cold_8();
LAB_00158b88:
    fs_write_alotof_bufs_cold_9();
LAB_00158b8d:
    fs_write_alotof_bufs_cold_10();
LAB_00158b92:
    fs_write_alotof_bufs_cold_12();
LAB_00158b97:
    fs_write_alotof_bufs_cold_13();
LAB_00158b9c:
    fs_write_alotof_bufs_cold_14();
LAB_00158ba1:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00158b5b;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b60;
    uv_fs_req_cleanup(&open_req1);
    lVar12 = 8;
    do {
      auVar15 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar7 + lVar12 + -8) = auVar15._0_8_;
      *(long *)((long)pvVar7 + lVar12) = auVar15._8_8_;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158b65;
    if (write_req.result != 0xac67d) goto LAB_00158b6a;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar8 = malloc(0xac67d);
    if (pvVar8 == (void *)0x0) goto LAB_00158b6f;
    lVar12 = 8;
    pvVar13 = pvVar8;
    do {
      auVar15 = uv_buf_init(pvVar13,0xd);
      *(long *)((long)pvVar7 + lVar12 + -8) = auVar15._0_8_;
      *(long *)((long)pvVar7 + lVar12) = auVar15._8_8_;
      lVar12 = lVar12 + 0x10;
      pvVar13 = (void *)((long)pvVar13 + 0xd);
    } while (lVar12 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar3 != 0) goto LAB_00158b74;
    if (close_req.result != 0) goto LAB_00158b79;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_00158b7e;
    if (open_req1.result._4_4_ < 0) goto LAB_00158b83;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158b88;
    if (read_req.result != 0x3400) goto LAB_00158b8d;
    unaff_R12 = 0;
    do {
      pcVar9 = (char *)((long)pvVar8 + unaff_R12);
      iVar3 = strncmp(pcVar9,test_buf,0xd);
      iVar2 = (int)pcVar9;
      if (iVar3 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158b56;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar8);
    iVar2 = (int)open_req1.result;
    _Var6 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00158b92;
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar14;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_00158b97;
    if (read_req.result != 0) goto LAB_00158b9c;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158ba1;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar7);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar7 = (void *)uv_default_loop();
  uv_walk(pvVar7,close_walk_cb,0);
  uv_run(pvVar7,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_f0 = (code *)0x158c0d;
  pvStack_d0 = pvVar7;
  lStack_c8 = unaff_R12;
  unlink("test_file");
  pcStack_f0 = (code *)0x158c12;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_f0 = (code *)0x158c23;
  pvVar8 = malloc(0xd4310);
  if (pvVar8 == (void *)0x0) {
LAB_00158f6f:
    pvVar8 = pvVar7;
    pcStack_f0 = (code *)0x158f74;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158f74:
    pcStack_f0 = (code *)0x158f79;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158f79:
    pcStack_f0 = (code *)0x158f7e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158f7e:
    pcStack_f0 = (code *)0x158f83;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158f83:
    pcStack_f0 = (code *)0x158f88;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158f88:
    pcStack_f0 = (code *)0x158f8d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158f8d:
    pcStack_f0 = (code *)0x158f92;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158f92:
    pcStack_f0 = (code *)0x158f97;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158f97:
    pcStack_f0 = (code *)0x158f9c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158f9c:
    pcStack_f0 = (code *)0x158fa1;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158fa1:
    pcStack_f0 = (code *)0x158fa6;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158fa6:
    pcStack_f0 = (code *)0x158fab;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158fab:
    pcStack_f0 = (code *)0x158fb0;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158fb0:
    pcStack_f0 = (code *)0x158fb5;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158fb5:
    pcStack_f0 = (code *)0x158fba;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_f0 = (code *)0x158c52;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158f74;
    if (open_req1.result._4_4_ < 0) goto LAB_00158f79;
    pcStack_f0 = (code *)0x158c74;
    uv_fs_req_cleanup(&open_req1);
    pcStack_f0 = (code *)0x158c85;
    uVar14 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_e8 = 0;
    pcStack_f0 = (code *)0x158cc3;
    iov = uVar14;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158f7e;
    if (write_req.result != 10) goto LAB_00158f83;
    pcStack_f0 = (code *)0x158ce8;
    uv_fs_req_cleanup(&write_req);
    lVar12 = 8;
    do {
      pcStack_f0 = (code *)0x158d02;
      auVar15 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar8 + lVar12 + -8) = auVar15._0_8_;
      *(long *)((long)pvVar8 + lVar12) = auVar15._8_8_;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0xd4318);
    uStack_e8 = 0;
    pcStack_f0 = (code *)0x158d43;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f88;
    if (write_req.result != 0xac67d) goto LAB_00158f8d;
    pcStack_f0 = (code *)0x158d68;
    uv_fs_req_cleanup(&write_req);
    pcStack_f0 = (code *)0x158d72;
    pcVar9 = (char *)malloc(0xac67d);
    if (pcVar9 == (char *)0x0) goto LAB_00158f92;
    lVar12 = 8;
    pcVar10 = pcVar9;
    do {
      pcStack_f0 = (code *)0x158d94;
      auVar15 = uv_buf_init(pcVar10,0xd);
      *(long *)((long)pvVar8 + lVar12 + -8) = auVar15._0_8_;
      *(long *)((long)pvVar8 + lVar12) = auVar15._8_8_;
      lVar12 = lVar12 + 0x10;
      pcVar10 = pcVar10 + 0xd;
    } while (lVar12 != 0xd4318);
    uStack_e8 = 0;
    pcStack_f0 = (code *)0x158dd6;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_00158f97;
    lStack_d8 = 10;
    lVar12 = 0xd;
    if (iVar2 != 0xd) {
      lVar12 = 0x3400;
    }
    if (read_req.result != lVar12) goto LAB_00158f9c;
    pcVar10 = pcVar9;
    uVar11 = 0;
    do {
      pcStack_f0 = (code *)0x158e20;
      iVar3 = strncmp(pcVar10,test_buf,0xd);
      if (iVar3 != 0) {
        pcStack_f0 = (code *)0x158f6f;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar7 = pvVar8;
        goto LAB_00158f6f;
      }
      if (iVar2 == 0xd) break;
      pcVar10 = pcVar10 + 0xd;
      bVar1 = uVar11 < 0x3ff;
      uVar11 = uVar11 + 1;
    } while (bVar1);
    pcStack_f0 = (code *)0x158e4d;
    uv_fs_req_cleanup(&read_req);
    pcStack_f0 = (code *)0x158e55;
    free(pcVar9);
    pcStack_f0 = (code *)0x158e6c;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    lVar12 = lStack_d8;
    if (iVar2 != 0) goto LAB_00158fa1;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + lStack_d8) goto LAB_00158fa6;
    pcStack_f0 = (code *)0x158ea0;
    uv_fs_req_cleanup(&stat_req);
    pcStack_f0 = (code *)0x158eb1;
    uVar14 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_e8 = 0;
    pcStack_f0 = (code *)0x158ef2;
    iov = uVar14;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,lVar12 + write_req.result);
    if (iVar2 != 0) goto LAB_00158fab;
    if (read_req.result != 0) goto LAB_00158fb0;
    pcStack_f0 = (code *)0x158f14;
    uv_fs_req_cleanup(&read_req);
    pcStack_f0 = (code *)0x158f2a;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158fb5;
    if (close_req.result == 0) {
      pcStack_f0 = (code *)0x158f48;
      uv_fs_req_cleanup(&close_req);
      pcStack_f0 = (code *)0x158f54;
      unlink("test_file");
      free(pvVar8);
      return;
    }
  }
  pcStack_f0 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_f0 = (code *)pvVar8;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_00159131;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159136;
    uv_fs_req_cleanup(&open_req1);
    uVar14 = (uv_buf_t)uv_buf_init(auStack_f2,2);
    iov = uVar14;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_0015913b;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00159145;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_00159131:
    run_test_fs_read_dir_cold_2();
LAB_00159136:
    run_test_fs_read_dir_cold_3();
LAB_0015913b:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159145:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_read_file_eof(int add_flags) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  RETURN_SKIP("Cygwin pread at EOF may (incorrectly) return data!");
#endif
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags, 0,
      NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(read_req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&read_req);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1,
                 read_req.result, NULL);
  ASSERT(r == 0);
  ASSERT(read_req.result == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}